

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

int __thiscall asl::Array<int>::dup(Array<int> *this,int __fd)

{
  int *piVar1;
  int *in_RAX;
  int in_ECX;
  void *in_RDX;
  void *in_R8;
  Array<int> local_18;
  
  if (this->_a[-2] != 1) {
    local_18._a = in_RAX;
    clone(&local_18,(__fn *)this,in_RDX,in_ECX,in_R8);
    if (this->_a != local_18._a) {
      LOCK();
      piVar1 = this->_a + -2;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        free(this->_a + -4);
        this->_a = (int *)0x0;
      }
      this->_a = (int *)local_18;
      LOCK();
      local_18._a[-2] = local_18._a[-2] + 1;
      UNLOCK();
    }
    LOCK();
    piVar1 = local_18._a + -2;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      free(local_18._a + -4);
    }
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}